

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

Vec_Ptr_t * Aig_ManDfs(Aig_Man_t *p,int fNodesOnly)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *local_60;
  int local_2c;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  int fNodesOnly_local;
  Aig_Man_t *p_local;
  
  Aig_ManIncrementTravId(p);
  pAVar3 = Aig_ManConst1(p);
  Aig_ObjSetTravIdCurrent(p,pAVar3);
  iVar1 = Aig_ManObjNumMax(p);
  p_00 = Vec_PtrAlloc(iVar1);
  if (fNodesOnly == 0) {
    pAVar3 = Aig_ManConst1(p);
    Vec_PtrPush(p_00,pAVar3);
  }
  else {
    for (local_2c = 0; iVar1 = Vec_PtrSize(p->vCis), local_2c < iVar1; local_2c = local_2c + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,local_2c);
      Aig_ObjSetTravIdCurrent(p,pAVar3);
    }
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vCos), local_2c < iVar1; local_2c = local_2c + 1) {
    local_60 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_2c);
    if (fNodesOnly != 0) {
      local_60 = Aig_ObjFanin0(local_60);
    }
    Aig_ManDfs_rec(p,local_60,p_00);
  }
  if (fNodesOnly == 0) {
    iVar1 = Vec_PtrSize(p_00);
    iVar2 = Aig_ManObjNum(p);
    if (iVar1 != iVar2) {
      __assert_fail("Vec_PtrSize(vNodes) == Aig_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                    ,0xa6,"Vec_Ptr_t *Aig_ManDfs(Aig_Man_t *, int)");
    }
  }
  else {
    iVar1 = Vec_PtrSize(p_00);
    iVar2 = Aig_ManNodeNum(p);
    if (iVar1 != iVar2) {
      __assert_fail("Vec_PtrSize(vNodes) == Aig_ManNodeNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                    ,0xa4,"Vec_Ptr_t *Aig_ManDfs(Aig_Man_t *, int)");
    }
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Aig_ManDfs( Aig_Man_t * p, int fNodesOnly )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManIncrementTravId( p );
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( Aig_ManObjNumMax(p) );
    // mark PIs if they should not be collected
    if ( fNodesOnly )
        Aig_ManForEachCi( p, pObj, i )
            Aig_ObjSetTravIdCurrent( p, pObj );
    else
        Vec_PtrPush( vNodes, Aig_ManConst1(p) );
    // collect nodes reachable in the DFS order
    Aig_ManForEachCo( p, pObj, i )
        Aig_ManDfs_rec( p, fNodesOnly? Aig_ObjFanin0(pObj): pObj, vNodes );
    if ( fNodesOnly )
        assert( Vec_PtrSize(vNodes) == Aig_ManNodeNum(p) );
    else
        assert( Vec_PtrSize(vNodes) == Aig_ManObjNum(p) );
    return vNodes;
}